

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::parse_arg_name
          (Arg *__return_storage_ptr__,BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **s
          )

{
  long lVar1;
  bool bVar2;
  FormatError *this_00;
  bool local_72;
  CStringRef local_48;
  BasicStringRef<char> local_40;
  char *local_30;
  char *error;
  char *pcStack_20;
  Char c;
  Char *start;
  Char **s_local;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *this_local;
  
  start = (Char *)s;
  s_local = (Char **)this;
  bVar2 = internal::is_name_start<char>(**s);
  if (!bVar2) {
    __assert_fail("internal::is_name_start(*s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/format.h"
                  ,0xef3,
                  "internal::Arg fmt::BasicFormatter<char>::parse_arg_name(const Char *&) [CharType = char, ArgFormatter = fmt::ArgFormatter<char>]"
                 );
  }
  pcStack_20 = *(char **)start;
  do {
    lVar1 = *(long *)start;
    *(long *)start = lVar1 + 1;
    error._7_1_ = *(char *)(lVar1 + 1);
    bVar2 = internal::is_name_start<char>(error._7_1_);
    local_72 = true;
    if (!bVar2) {
      local_72 = '/' < error._7_1_ && error._7_1_ < ':';
    }
  } while (local_72);
  local_30 = (char *)0x0;
  BasicStringRef<char>::BasicStringRef(&local_40,pcStack_20,*(long *)start - (long)pcStack_20);
  get_arg(__return_storage_ptr__,this,local_40,&local_30);
  if (local_30 != (char *)0x0) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_48,local_30);
    FormatError::FormatError(this_00,local_48);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return __return_storage_ptr__;
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::parse_arg_name(const Char *&s) {
  assert(internal::is_name_start(*s));
  const Char *start = s;
  Char c;
  do {
    c = *++s;
  } while (internal::is_name_start(c) || ('0' <= c && c <= '9'));
  const char *error = FMT_NULL;
  internal::Arg arg = get_arg(BasicStringRef<Char>(start, s - start), error);
  if (error)
    FMT_THROW(FormatError(error));
  return arg;
}